

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSSetUserData(void *arkode_mem,void *user_data)

{
  ARKodeMem in_RSI;
  int retval;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = arkLs_AccessLMem(in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                             (ARKLsMem *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (local_4 == 0) {
    if (*(int *)(in_stack_ffffffffffffffd8 + 1) == 0) {
      in_stack_ffffffffffffffd8[3] = in_RSI;
    }
    if (*(int *)(in_stack_ffffffffffffffd8 + 0x1d) == 0) {
      in_stack_ffffffffffffffd8[0x21] = in_RSI;
    }
    if (*(int *)(in_stack_ffffffffffffffd8 + 0x22) != 0) {
      in_stack_ffffffffffffffd8[0x24] = in_RSI;
    }
    in_stack_ffffffffffffffd8[0x1c] = in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkLSSetUserData(void *arkode_mem, void* user_data)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSSetUserData",
                            &ark_mem, &arkls_mem);
  if (retval != ARKLS_SUCCESS) return(retval);

  /* Set data for Jacobian */
  if (!arkls_mem->jacDQ)
    arkls_mem->J_data = user_data;

  /* Set data for Jtimes */
  if (!arkls_mem->jtimesDQ)
    arkls_mem->Jt_data = user_data;

  /* Set data for LinSys */
  if (arkls_mem->user_linsys)
    arkls_mem->A_data = user_data;

  /* Set data for Preconditioner */
  arkls_mem->P_data = user_data;

  return(ARKLS_SUCCESS);
}